

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBlit.h
# Opt level: O0

void irr::executeBlit_TextureCopy_24_to_16(SBlitJob *job)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  u16 uVar7;
  byte *pbVar8;
  long in_RDI;
  u32 dx_1;
  u8 *s;
  u32 dy_1;
  u8 *src_x;
  u32 dx;
  u32 src_y;
  u32 dy;
  float hscale;
  float wscale;
  u16 *dst;
  u8 *src;
  u32 h;
  u32 w;
  uint local_54;
  byte *local_50;
  uint local_44;
  uint local_34;
  uint local_2c;
  long local_20;
  byte *local_18;
  
  uVar3 = *(uint *)(in_RDI + 0x38);
  uVar4 = *(uint *)(in_RDI + 0x3c);
  local_18 = *(byte **)(in_RDI + 0x28);
  local_20 = *(long *)(in_RDI + 0x30);
  if ((*(byte *)(in_RDI + 0x50) & 1) == 0) {
    for (local_44 = 0; local_44 != uVar4; local_44 = local_44 + 1) {
      local_50 = local_18;
      for (local_54 = 0; local_54 != uVar3; local_54 = local_54 + 1) {
        uVar7 = video::RGBA16((uint)*local_50,(uint)local_50[1],(uint)local_50[2],0xff);
        *(u16 *)(local_20 + (ulong)local_54 * 2) = uVar7;
        local_50 = local_50 + 3;
      }
      local_18 = local_18 + *(int *)(in_RDI + 0x48);
      local_20 = local_20 + (ulong)*(uint *)(in_RDI + 0x4c);
    }
  }
  else {
    fVar1 = *(float *)(in_RDI + 0x54);
    fVar2 = *(float *)(in_RDI + 0x58);
    for (local_2c = 0; local_2c < uVar4; local_2c = local_2c + 1) {
      lVar6 = *(long *)(in_RDI + 0x28);
      iVar5 = *(int *)(in_RDI + 0x48);
      for (local_34 = 0; local_34 < uVar3; local_34 = local_34 + 1) {
        pbVar8 = (byte *)(lVar6 + (ulong)(uint)(iVar5 * (int)(long)((float)local_2c * fVar2)) +
                         ((long)((float)local_34 * fVar1 * 3.0) & 0xffffffffU));
        uVar7 = video::RGBA16((uint)*pbVar8,(uint)pbVar8[1],(uint)pbVar8[2],0xff);
        *(u16 *)(local_20 + (ulong)local_34 * 2) = uVar7;
      }
      local_20 = local_20 + (ulong)*(uint *)(in_RDI + 0x4c);
    }
  }
  return;
}

Assistant:

static void executeBlit_TextureCopy_24_to_16(const SBlitJob *job)
{
	const u32 w = job->width;
	const u32 h = job->height;
	const u8 *src = static_cast<const u8 *>(job->src);
	u16 *dst = static_cast<u16 *>(job->dst);

	if (job->stretch) {
		const float wscale = job->x_stretch * 3.f;
		const float hscale = job->y_stretch;

		for (u32 dy = 0; dy < h; ++dy) {
			const u32 src_y = (u32)(dy * hscale);
			src = (u8 *)(job->src) + job->srcPitch * src_y;

			for (u32 dx = 0; dx < w; ++dx) {
				const u8 *src_x = src + (u32)(dx * wscale);
				dst[dx] = video::RGBA16(src_x[0], src_x[1], src_x[2]);
			}
			dst = (u16 *)((u8 *)(dst) + job->dstPitch);
		}
	} else {
		for (u32 dy = 0; dy != h; ++dy) {
			const u8 *s = src;
			for (u32 dx = 0; dx != w; ++dx) {
				dst[dx] = video::RGBA16(s[0], s[1], s[2]);
				s += 3;
			}

			src = src + job->srcPitch;
			dst = (u16 *)((u8 *)(dst) + job->dstPitch);
		}
	}
}